

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_lldt_x86_64(CPUX86State *env,int selector)

{
  int iVar1;
  uint32_t e1_00;
  uint32_t e2_00;
  uint32_t uVar2;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  uint32_t e3;
  target_ulong ptr;
  int entry_limit;
  int index;
  uint32_t e2;
  uint32_t e1;
  SegmentCache *dt;
  int selector_local;
  CPUX86State *env_local;
  
  if ((selector & 0xfffcU) == 0) {
    (env->ldt).base = 0;
    (env->ldt).limit = 0;
  }
  else {
    if ((selector & 4U) != 0) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    if ((env->hflags & 0x4000) == 0) {
      ptr._0_4_ = 7;
    }
    else {
      ptr._0_4_ = 0xf;
    }
    if ((env->gdt).limit < (selector & 0xfff8U) + (int)ptr) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    addr = (env->gdt).base + (long)(int)(selector & 0xfff8U);
    iVar1 = cpu_mmu_index_kernel(env);
    e1_00 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar1,unaff_retaddr);
    iVar1 = cpu_mmu_index_kernel(env);
    e2_00 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,iVar1,unaff_retaddr);
    if (((e2_00 & 0x1000) != 0) || ((e2_00 >> 8 & 0xf) != 2)) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    if ((e2_00 & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(env,0xb,selector & 0xfffc,unaff_retaddr);
    }
    if ((env->hflags & 0x4000) == 0) {
      load_seg_cache_raw_dt(&env->ldt,e1_00,e2_00);
    }
    else {
      iVar1 = cpu_mmu_index_kernel(env);
      uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,iVar1,unaff_retaddr);
      load_seg_cache_raw_dt(&env->ldt,e1_00,e2_00);
      (env->ldt).base = (ulong)uVar2 << 0x20 | (env->ldt).base;
    }
  }
  (env->ldt).selector = selector & 0xffff;
  return;
}

Assistant:

void helper_lldt(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* XXX: NULL selector case: invalid LDT */
        env->ldt.base = 0;
        env->ldt.limit = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
            env->ldt.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
        }
    }
    env->ldt.selector = selector;
}